

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::CharN
          (AsciiParser *this,size_t n,vector<char,_std::allocator<char>_> *nc)

{
  ssize_t sVar1;
  vector<char,_std::allocator<char>_> buf;
  allocator_type local_39;
  _Vector_base<char,_std::allocator<char>_> local_38;
  
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_38,n,&local_39);
  sVar1 = StreamReader::read(this->_sr,(int)n,(void *)n,
                             (size_t)local_38._M_impl.super__Vector_impl_data._M_start);
  if (sVar1 != 0) {
    ::std::vector<char,_std::allocator<char>_>::operator=
              (nc,(vector<char,_std::allocator<char>_> *)&local_38);
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_38);
  return sVar1 != 0;
}

Assistant:

bool AsciiParser::CharN(size_t n, std::vector<char> *nc) {
  std::vector<char> buf(n);

  bool ok = _sr->read(n, n, reinterpret_cast<uint8_t *>(buf.data()));
  if (ok) {
    (*nc) = buf;
  }

  return ok;
}